

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_widgets.cpp
# Opt level: O0

bool QTest::qWaitForWindowExposed(QWidget *widget,int timeout)

{
  bool bVar1;
  undefined4 in_ESI;
  long in_FS_OFFSET;
  undefined1 local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = qWaitForWidgetWindow<QTest::qWaitForWindowExposed(QWidget*,int)::__0,QTest::qWaitForWindowExposed(QWidget*,int)::__1,int>
                    (local_10,in_ESI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

Q_WIDGETS_EXPORT bool QTest::qWaitForWindowExposed(QWidget *widget, int timeout)
{
    return qWaitForWidgetWindow([&]() { return widget->window()->windowHandle(); },
                                [&](QWindow *window) { return window->isExposed(); },
                                timeout);
}